

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean4
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1
          ,bool reference2,bool reference3)

{
  ostringstream *this_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0.m_preguard[0] = 0xde;
  local_1c0.m_preguard[1] = 0xde;
  local_1c0.m_preguard[2] = 0xde;
  local_1c0.m_preguard[3] = 0xde;
  local_1c0.m_value[0] = 0xde;
  local_1c0.m_value[1] = 0xde;
  local_1c0.m_value[2] = 0xde;
  local_1c0.m_value[3] = 0xde;
  local_1c0.m_postguard[0] = 0xde;
  local_1c0.m_postguard[1] = 0xde;
  local_1c0.m_postguard[2] = 0xde;
  local_1c0.m_postguard[3] = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1c0.m_value);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    (&local_1c0,testCtx);
  if ((bVar3) &&
     (((((bool)local_1c0.m_value[0] != reference0 || ((bool)local_1c0.m_value[1] != reference1)) ||
       ((bool)local_1c0.m_value[2] != reference2)) || ((bool)local_1c0.m_value[3] != reference3))))
  {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar1 = "mapped_ == GL_FALSE";
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference0) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2 + 0xb,8 - (ulong)reference0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference1) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2 + 0xb,8 - (ulong)reference1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference2) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2 + 0xb,8 - (ulong)reference2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    if (reference3) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar1 + 0xb,8 - (ulong)reference3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference1 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference2 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference3 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
	};

	if (boolVector4[0] != referenceAsGLBoolean[0] ||
		boolVector4[1] != referenceAsGLBoolean[1] ||
		boolVector4[2] != referenceAsGLBoolean[2] ||
		boolVector4[3] != referenceAsGLBoolean[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}